

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorBlock.cpp
# Opt level: O0

void __thiscall nv::ColorBlock::sortColorsByAbsoluteValue(ColorBlock *this)

{
  uint32 uVar1;
  anon_union_2_2_12391d8d_for_Color16_0 local_22;
  uint local_20;
  Color16 cb;
  uint b;
  uint uStack_14;
  Color16 cmax;
  uint max;
  uint a;
  ColorBlock *this_local;
  
  for (uStack_14 = 0; uStack_14 < 0x10; uStack_14 = uStack_14 + 1) {
    b = uStack_14;
    uVar1 = Color32::operator_cast_to_unsigned_int(this->m_color + uStack_14);
    Color16::Color16(&cb,(uint16)uVar1);
    local_20 = uStack_14;
    while (local_20 = local_20 + 1, local_20 < 0x10) {
      uVar1 = Color32::operator_cast_to_unsigned_int(this->m_color + local_20);
      Color16::Color16((Color16 *)&local_22.field_0,(uint16)uVar1);
      if ((ushort)cb.field_0 < local_22.u) {
        b = local_20;
        cb.field_0 = (anon_union_2_2_12391d8d_for_Color16_0)
                     (anon_union_2_2_12391d8d_for_Color16_0)local_22.field_0;
      }
    }
    swap<nv::Color32>(this->m_color + uStack_14,this->m_color + b);
  }
  return;
}

Assistant:

void ColorBlock::sortColorsByAbsoluteValue()
{
	// Dummy selection sort.
	for( uint a = 0; a < 16; a++ ) {
		uint max = a;
		Color16 cmax(m_color[a]);
		
		for( uint b = a+1; b < 16; b++ ) {
			Color16 cb(m_color[b]);
			
			if( cb.u > cmax.u ) {
				max = b;
				cmax = cb;
			}
		}
		swap( m_color[a], m_color[max] );
	}
}